

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdpc.c
# Opt level: O3

void hdpc_generate_mat_faster(m256v *H,parameters *P)

{
  uint8_t uVar1;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  long lVar9;
  m256v G_HDPC;
  m256v I_H;
  m256v mStack_58;
  m256v local_40;
  
  m256v_get_subview(&mStack_58,H,0,0,P->H,P->S + P->Kprime);
  iVar7 = P->H;
  if (0 < iVar7) {
    uVar1 = '\x01';
    lVar9 = 0;
    do {
      mStack_58.e[(long)P->S + (long)P->Kprime + mStack_58.rstride * lVar9 + -1] = uVar1;
      uVar1 = gf256_mul(uVar1,'\x02');
      lVar9 = lVar9 + 1;
      iVar7 = P->H;
    } while (lVar9 < iVar7);
  }
  iVar3 = P->Kprime;
  iVar5 = P->S;
  uVar6 = (iVar3 + iVar5) - 2;
  if (-1 < (int)uVar6) {
    uVar4 = (ulong)uVar6;
    do {
      iVar7 = P->H;
      if (0 < iVar7) {
        lVar9 = 0;
        do {
          uVar1 = gf256_mul('\x02',mStack_58.e[uVar4 + 1 + mStack_58.rstride * lVar9]);
          mStack_58.e[uVar4 + mStack_58.rstride * lVar9] = uVar1;
          lVar9 = lVar9 + 1;
          iVar7 = P->H;
        } while (lVar9 < iVar7);
      }
      iVar3 = (int)uVar4;
      uVar8 = iVar3 + 1;
      uVar2 = Rand(uVar8,6,iVar7);
      uVar1 = gf256_add('\x01',mStack_58.e[uVar4 + mStack_58.rstride * (long)(int)uVar2]);
      mStack_58.e[uVar4 + mStack_58.rstride * (long)(int)uVar2] = uVar1;
      uVar8 = Rand(uVar8,7,P->H + -1);
      lVar9 = (long)(int)((uVar8 + uVar2 + 1) % (uint)P->H);
      uVar1 = gf256_add('\x01',mStack_58.e[uVar4 + mStack_58.rstride * lVar9]);
      mStack_58.e[uVar4 + lVar9 * mStack_58.rstride] = uVar1;
      uVar4 = uVar4 - 1;
    } while (0 < iVar3);
    iVar3 = P->Kprime;
    iVar5 = P->S;
    iVar7 = P->H;
  }
  m256v_get_subview(&local_40,H,0,iVar5 + iVar3,iVar7,iVar7);
  m256v_clear(&local_40);
  if (0 < P->H) {
    lVar9 = 0;
    do {
      local_40.e[lVar9 + local_40.rstride * lVar9] = '\x01';
      lVar9 = lVar9 + 1;
    } while (lVar9 < P->H);
  }
  return;
}

Assistant:

void hdpc_generate_mat_faster(m256v* H, const parameters* P)
{
	assert(H->n_row == P->H);
	assert(H->n_col == P->L);

	/* Create G_HDPC */
	m256v G_HDPC = m256v_get_subview(H, 0, 0, P->H, P->Kprime + P->S);
	uint8_t val = 1;
	for (int j = 0; j < P->H; ++j) {
		m256v_set_el(&G_HDPC, j, P->Kprime + P->S - 1, val);
		val = gf256_mul(val, 2);
	}
	for (int j = P->Kprime + P->S - 2; j >= 0; --j) {
		/* Copy over previous column, multiplied by alpha */
		for (int i = 0; i < P->H; ++i) {
			m256v_set_el(&G_HDPC, i, j,
			  gf256_mul(2, m256v_get_el(&G_HDPC, i, j + 1)));
		}

		/* Add in the two flipped positions */
		int a = Rand(j + 1, 6, P->H);
		m256v_set_el(&G_HDPC, a, j,
		  gf256_add(1, m256v_get_el(&G_HDPC, a, j)));
		a = (a + Rand(j + 1, 7, P->H - 1) + 1) % P->H;
		m256v_set_el(&G_HDPC, a, j,
		  gf256_add(1, m256v_get_el(&G_HDPC, a, j)));
	}

	/* Create I_H */
	m256v I_H = m256v_get_subview(H, 0, P->Kprime + P->S, P->H, P->H);
	m256v_clear(&I_H);
	for (int i = 0; i < P->H; ++i) {
		m256v_set_el(&I_H, i, i, 1);
	}
}